

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

float __thiscall LumaQuantizer::dequantize(LumaQuantizer *this,float val,uint ch)

{
  float *pfVar1;
  float local_24;
  float local_20;
  float local_1c;
  uint local_18;
  float res;
  uint ch_local;
  float val_local;
  LumaQuantizer *this_local;
  
  if (((ch == 0) || (this->m_colorSpace == CS_RGB)) || (this->m_colorSpace == CS_XYZ)) {
    if (0.0 <= val) {
      if (val < (float)this->m_maxVal) {
        local_1c = this->m_mapping[(int)val];
      }
      else {
        local_1c = this->m_mapping[this->m_maxVal];
      }
    }
    else {
      local_1c = *this->m_mapping;
    }
  }
  else {
    local_20 = val / (float)this->m_maxValColor;
    local_24 = 1e-10;
    local_18 = ch;
    res = val;
    _ch_local = this;
    pfVar1 = std::max<float>(&local_20,&local_24);
    local_1c = *pfVar1;
  }
  return local_1c;
}

Assistant:

float LumaQuantizer::dequantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {	
	    if( val < 0 )
		    res = m_mapping[0];
	    else if( val >= m_maxVal )
		    res = m_mapping[m_maxVal];
	    else
		    res = m_mapping[(int)val];	
    }
    else
        res = std::max(val/m_maxValColor, 1e-10f);    
    
	return res;
}